

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O0

int test_ipcmsg_resultsummary(ITesting *t)

{
  pointer *this;
  bool bVar1;
  kTRContinueMode kVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  kTRContinueMode tr_temp_res_6;
  kTRContinueMode tr_temp_res_5;
  kTRContinueMode tr_temp_res_4;
  kTRContinueMode tr_temp_res_3;
  kTRContinueMode tr_temp_res_2;
  IPCBinaryDecoder decoder;
  IPCResultSummary resultSummaryIn;
  UTest_IPC_VectorReader vectorReader;
  kTRContinueMode tr_temp_res_1;
  undefined1 local_b8 [4];
  kTRContinueMode tr_temp_res;
  IPCBinaryEncoder encoder;
  undefined1 local_98 [8];
  IPCBufferedWriter bufferedWriter;
  UTest_IPC_VectorWriter vectorWriter;
  IPCResultSummary resultSummaryOut;
  ITesting *t_local;
  
  gnilk::IPCResultSummary::IPCResultSummary
            ((IPCResultSummary *)
             &vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  this = &bufferedWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  UTest_IPC_VectorWriter::UTest_IPC_VectorWriter((UTest_IPC_VectorWriter *)this);
  gnilk::IPCBufferedWriter::IPCBufferedWriter((IPCBufferedWriter *)local_98,(IPCWriter *)this);
  gnilk::IPCBinaryEncoder::IPCBinaryEncoder((IPCBinaryEncoder *)local_b8,(IPCWriter *)local_98);
  bVar1 = gnilk::IPCResultSummary::Marshal
                    ((IPCResultSummary *)
                     &vectorWriter.data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(IPCEncoderBase *)local_b8);
  if ((bVar1) ||
     (kVar2 = (*t->AssertError)(0x23,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"resultSummaryOut.Marshal(encoder)"), kVar2 != kTRLeave)) {
    gnilk::IPCBufferedWriter::Flush((IPCBufferedWriter *)local_98);
    pvVar3 = UTest_IPC_VectorWriter::Data
                       ((UTest_IPC_VectorWriter *)
                        &bufferedWriter.data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(pvVar3);
    if ((bVar1) &&
       (kVar2 = (*t->AssertError)(0x27,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                  ,"!vectorWriter.Data().empty()"), kVar2 == kTRLeave)) {
      t_local._4_4_ = 0x10;
    }
    else {
      pvVar3 = UTest_IPC_VectorWriter::Data
                         ((UTest_IPC_VectorWriter *)
                          &bufferedWriter.data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      UTest_IPC_VectorReader::UTest_IPC_VectorReader
                ((UTest_IPC_VectorReader *)
                 &resultSummaryIn.testResults.
                  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar3);
      gnilk::IPCResultSummary::IPCResultSummary((IPCResultSummary *)&decoder.deserializer);
      gnilk::IPCBinaryDecoder::IPCBinaryDecoder
                ((IPCBinaryDecoder *)&tr_temp_res_3,
                 (IPCReader *)
                 &resultSummaryIn.testResults.
                  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (IPCDeserializer *)&resultSummaryIn);
      bVar1 = gnilk::IPCBinaryDecoder::Process((IPCBinaryDecoder *)&tr_temp_res_3);
      if ((bVar1) ||
         (kVar2 = (*t->AssertError)(0x2f,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                    ,"decoder.Process()"), kVar2 != kTRLeave)) {
        bVar1 = gnilk::IPCBinaryDecoder::Available((IPCBinaryDecoder *)&tr_temp_res_3);
        if ((bVar1) &&
           (kVar2 = (*t->AssertError)(0x30,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                      ,"decoder.Available() == false"), kVar2 == kTRLeave)) {
          t_local._4_4_ = 0x10;
        }
        else if (((int)resultSummaryIn.super_IPCDeserializer.super_IPCObject._vptr_IPCObject == 1)
                || (kVar2 = (*t->AssertError)(0x33,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                              ,
                                              "resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted"
                                             ), kVar2 != kTRLeave)) {
          if ((resultSummaryIn.super_IPCDeserializer.super_IPCObject._vptr_IPCObject._4_4_ == 2) ||
             (kVar2 = (*t->AssertError)(0x34,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                        ,
                                        "resultSummaryIn.testsFailed == resultSummaryOut.testsFailed"
                                       ), kVar2 != kTRLeave)) {
            if ((((double)resultSummaryIn._16_8_ == 3.0) && (!NAN((double)resultSummaryIn._16_8_)))
               || (kVar2 = (*t->AssertError)(0x35,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                             ,
                                             "resultSummaryIn.durationSec == resultSummaryOut.durationSec"
                                            ), kVar2 != kTRLeave)) {
              t_local._4_4_ = 0;
            }
            else {
              t_local._4_4_ = 0x10;
            }
          }
          else {
            t_local._4_4_ = 0x10;
          }
        }
        else {
          t_local._4_4_ = 0x10;
        }
      }
      else {
        t_local._4_4_ = 0x10;
      }
      gnilk::IPCResultSummary::~IPCResultSummary((IPCResultSummary *)&decoder.deserializer);
    }
  }
  else {
    t_local._4_4_ = 0x10;
  }
  gnilk::IPCBufferedWriter::~IPCBufferedWriter((IPCBufferedWriter *)local_98);
  UTest_IPC_VectorWriter::~UTest_IPC_VectorWriter
            ((UTest_IPC_VectorWriter *)
             &bufferedWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  gnilk::IPCResultSummary::~IPCResultSummary
            ((IPCResultSummary *)
             &vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return t_local._4_4_;
}

Assistant:

DLL_EXPORT int test_ipcmsg_resultsummary(ITesting *t) {
    gnilk::IPCResultSummary resultSummaryOut;
    resultSummaryOut.testsExecuted = 1;
    resultSummaryOut.testsFailed = 2;
    resultSummaryOut.durationSec = 3.0;

    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, resultSummaryOut.Marshal(encoder));

    // Flush data - this will do the actual writing to the underlying writer
    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCResultSummary resultSummaryIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, resultSummaryIn);

    // Deserialize
    TR_ASSERT(t, decoder.Process());
    TR_ASSERT(t, decoder.Available() == false);

    // Make sure we have everything
    TR_ASSERT(t, resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted);
    TR_ASSERT(t, resultSummaryIn.testsFailed == resultSummaryOut.testsFailed);
    TR_ASSERT(t, resultSummaryIn.durationSec == resultSummaryOut.durationSec);


    return kTR_Pass;
}